

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# findstr.cpp
# Opt level: O3

ByteMaskType * __thiscall
hexpattern::decodechunk(ByteMaskType *__return_storage_ptr__,hexpattern *this,string *chunk)

{
  char c;
  size_type sVar1;
  pointer pcVar2;
  bool bVar3;
  ByteMaskType *pBVar4;
  int iVar5;
  size_type sVar6;
  ByteVector mask;
  ByteVector data;
  byte local_7a;
  byte local_79;
  vector<unsigned_char,_std::allocator<unsigned_char>_> local_78;
  vector<unsigned_char,_std::allocator<unsigned_char>_> local_58;
  ByteMaskType *local_38;
  
  local_58.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (uchar *)0x0;
  local_58.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  local_58.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_finish = (uchar *)0x0;
  local_79 = 0;
  local_78.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (uchar *)0x0;
  local_78.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  local_78.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_finish = (uchar *)0x0;
  local_7a = 0;
  sVar1 = chunk->_M_string_length;
  local_38 = __return_storage_ptr__;
  if (sVar1 != 0) {
    pcVar2 = (chunk->_M_dataplus)._M_p;
    bVar3 = true;
    sVar6 = 0;
    do {
      c = pcVar2[sVar6];
      iVar5 = convertnyble(c);
      if (iVar5 == -2) {
        if (bVar3) {
          local_79 = 0;
          local_7a = 0;
        }
        else {
LAB_0010ceaa:
          if (local_58.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
              super__Vector_impl_data._M_finish ==
              local_58.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
              super__Vector_impl_data._M_end_of_storage) {
            std::vector<unsigned_char,std::allocator<unsigned_char>>::
            _M_realloc_insert<unsigned_char_const&>
                      ((vector<unsigned_char,std::allocator<unsigned_char>> *)&local_58,
                       (iterator)
                       local_58.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                       _M_impl.super__Vector_impl_data._M_finish,&local_79);
          }
          else {
            *local_58.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
             super__Vector_impl_data._M_finish = local_79;
            local_58.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
            super__Vector_impl_data._M_finish =
                 local_58.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                 super__Vector_impl_data._M_finish + 1;
          }
          if (local_78.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
              super__Vector_impl_data._M_finish ==
              local_78.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
              super__Vector_impl_data._M_end_of_storage) {
            std::vector<unsigned_char,std::allocator<unsigned_char>>::
            _M_realloc_insert<unsigned_char_const&>
                      ((vector<unsigned_char,std::allocator<unsigned_char>> *)&local_78,
                       (iterator)
                       local_78.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                       _M_impl.super__Vector_impl_data._M_finish,&local_7a);
          }
          else {
            *local_78.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
             super__Vector_impl_data._M_finish = local_7a;
            local_78.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
            super__Vector_impl_data._M_finish =
                 local_78.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                 super__Vector_impl_data._M_finish + 1;
          }
        }
LAB_0010cefa:
        bVar3 = (bool)(bVar3 ^ 1);
      }
      else if (iVar5 != -1) {
        iVar5 = convertnyble(c);
        if (!bVar3) {
          local_79 = local_79 | (byte)iVar5;
          local_7a = local_7a | 0xf;
          goto LAB_0010ceaa;
        }
        local_79 = (byte)iVar5 << 4;
        local_7a = 0xf0;
        goto LAB_0010cefa;
      }
      sVar6 = sVar6 + 1;
    } while (sVar1 != sVar6);
  }
  pBVar4 = local_38;
  std::
  pair<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
  ::
  pair<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_&,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_&,_true>
            (local_38,&local_58,&local_78);
  if (local_78.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
      super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_78.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                    _M_impl.super__Vector_impl_data._M_start,
                    (long)local_78.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                          ._M_impl.super__Vector_impl_data._M_end_of_storage -
                    (long)local_78.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                          ._M_impl.super__Vector_impl_data._M_start);
  }
  if (local_58.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
      super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_58.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                    _M_impl.super__Vector_impl_data._M_start,
                    (long)local_58.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                          ._M_impl.super__Vector_impl_data._M_end_of_storage -
                    (long)local_58.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                          ._M_impl.super__Vector_impl_data._M_start);
  }
  return pBVar4;
}

Assistant:

ByteMaskType decodechunk(const std::string& chunk)
    {
        ByteVector data;  uint8_t datavalue = 0;
        ByteVector mask;  uint8_t maskvalue = 0;

        bool hi = true;
        for (auto c : chunk)
        {
            int nyble = convertnyble(c);
            if (nyble == -1)
                continue;

            if (nyble == -2) {
                if (hi) {
                    datavalue = 0;
                    maskvalue = 0;
                }
            }
            else {
                int nyble = convertnyble(c);
                if (hi) {
                    datavalue = nyble << 4;
                    maskvalue = 0xF0;
                }
                else {
                    datavalue |= nyble;
                    maskvalue |= 0x0F;
                }
            }

            if (!hi) {
                data.push_back(datavalue);
                mask.push_back(maskvalue);
            }
            hi = !hi;
        }
        return std::make_pair(data, mask);
    }